

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reoUnits.c
# Opt level: O1

void reoUnitsRecycleUnitList(reo_man *p,reo_plane *pPlane)

{
  reo_unit *prVar1;
  reo_unit *prVar2;
  reo_unit *prVar3;
  
  prVar1 = pPlane->pHead;
  prVar2 = prVar1;
  if (prVar1 != (reo_unit *)0x0) {
    do {
      prVar3 = prVar2;
      prVar2 = prVar3->Next;
    } while (prVar2 != (reo_unit *)0x0);
    prVar3->Next = p->pUnitFreeList;
    p->pUnitFreeList = prVar1;
    pPlane->statsCostAbove = 0.0;
    pPlane->statsCostBelow = 0.0;
    pPlane->statsApl = 0.0;
    pPlane->statsCost = 0.0;
    pPlane->fSifted = 0;
    pPlane->statsNodes = 0;
    *(undefined8 *)&pPlane->statsWidth = 0;
    pPlane->pHead = (reo_unit *)0x0;
  }
  return;
}

Assistant:

void reoUnitsRecycleUnitList( reo_man * p, reo_plane * pPlane )
{
    reo_unit * pUnit;
    reo_unit * pTail = NULL; // Suppress "might be used uninitialized"

    if ( pPlane->pHead == NULL )
        return;

    // find the tail
    for ( pUnit = pPlane->pHead; pUnit; pUnit = pUnit->Next )
        pTail = pUnit;
    pTail->Next = p->pUnitFreeList;
    p->pUnitFreeList    = pPlane->pHead;
    memset( pPlane, 0, sizeof(reo_plane) );
//    pPlane->pHead = NULL;
}